

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptReflect.cpp
# Opt level: O1

Var Js::JavascriptReflect::EntrySetPrototypeOf(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptBoolean *pJVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Var pvVar7;
  RecyclableObject *pRVar8;
  RecyclableObject *newPrototype;
  int32 hCode;
  int in_stack_00000010;
  undefined1 local_70 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)__tag.entry.next) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x133,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00d1173e;
    *puVar6 = 0;
  }
  callInfo_local = (CallInfo)__tag.entry.next;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,(CallInfo *)&__tag.entry.next);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_70,function,(CallInfo)__tag.entry.next,
             L"Reflect.setPrototypeOf",&stack0x00000000);
  if (((ulong)callInfo_local & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x137,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar4) {
LAB_00d1173e:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  if ((callInfo_local._0_4_ >> 0x18 & 1) == 0) {
    hCode = -0x7ff5ec36;
    if (((ulong)callInfo_local & 0xfffffe) != 0) {
      pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      BVar5 = JavascriptOperators::IsObject(pvVar7);
      if (BVar5 != 0) {
        pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,1);
        pRVar8 = JavascriptOperators::ToObject(pvVar7,pSVar1);
        if (2 < (callInfo_local._0_4_ & 0xffffff)) {
          pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,2);
          BVar5 = JavascriptOperators::IsObjectOrNull(pvVar7);
          if (BVar5 != 0) {
            pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,2);
            newPrototype = VarTo<Js::RecyclableObject>(pvVar7);
            pRVar8 = VarTo<Js::RecyclableObject>(pRVar8);
            BVar5 = JavascriptObject::ChangePrototype(pRVar8,newPrototype,false,pSVar1);
            pJVar2 = (&(((pSVar1->super_ScriptContextBase).javascriptLibrary)->
                       super_JavascriptLibraryBase).booleanTrue)[BVar5 == 0].ptr;
            AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry
                      ((AutoTagNativeLibraryEntry *)local_70);
            return pJVar2;
          }
        }
        JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec31,L"Object.setPrototypeOf");
      }
    }
  }
  else {
    hCode = -0x7ff5ebf5;
  }
  JavascriptError::ThrowTypeError(pSVar1,hCode,L"Reflect.setPrototypeOf");
}

Assistant:

Var JavascriptReflect::EntrySetPrototypeOf(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Reflect.setPrototypeOf"));

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        if  (args.Info.Flags & CallFlags_New)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ErrorOnNew, _u("Reflect.setPrototypeOf"));
        }

        if (args.Info.Count < 2 || !JavascriptOperators::IsObject(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("Reflect.setPrototypeOf"));
        }
        Var target = args[1];
        target = JavascriptOperators::ToObject(target, scriptContext);

        if (args.Info.Count < 3 || !JavascriptOperators::IsObjectOrNull(args[2]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NotObjectOrNull, _u("Object.setPrototypeOf"));
        }

        RecyclableObject* newPrototype = VarTo<RecyclableObject>(args[2]);
        BOOL changeResult = JavascriptObject::ChangePrototype(VarTo<RecyclableObject>(target), newPrototype, /*validate*/false, scriptContext);

        return scriptContext->GetLibrary()->GetTrueOrFalse(changeResult);
    }